

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conway-cubes.cpp
# Opt level: O0

rect_t<char> *
read_rect(rect_t<char> *__return_storage_ptr__,
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *lines)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  size_type __n;
  iterator iVar2;
  allocator<std::vector<char,_std::allocator<char>_>_> local_1a;
  undefined1 local_19;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *lines_local;
  rect_t<char> *rect;
  
  local_19 = 0;
  local_18 = lines;
  lines_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)__return_storage_ptr__;
  __n = std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::size(lines);
  std::allocator<std::vector<char,_std::allocator<char>_>_>::allocator(&local_1a);
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__,__n,&local_1a);
  std::allocator<std::vector<char,_std::allocator<char>_>_>::~allocator(&local_1a);
  pvVar1 = local_18;
  iVar2 = std::
          vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
          ::begin(__return_storage_ptr__);
  std::ranges::__transform_fn::
  operator()<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,___gnu_cxx::__normal_iterator<std::vector<char,_std::allocator<char>_>_*,_std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_tomlankhorst[P]advent_of_code_2020_cpp_day17_conway_cubes_cpp:61:42),_std::identity>
            ((__transform_fn *)&std::ranges::transform,pvVar1,iVar2._M_current);
  return __return_storage_ptr__;
}

Assistant:

rect_t<char> read_rect(const std::vector<std::string>& lines) {
  auto rect = rect_t<char> (lines.size());

  ranges::transform(lines, rect.begin(), [](const std::string& l){
    auto line = line_t<char> (l.size());
    ranges::copy(l, line.begin());
    return line;
  });

  return rect;
}